

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<double,_3,_4> * tcu::operator*(Matrix<double,_3,_1> *a,Matrix<double,_1,_4> *b)

{
  Vector<double,_1> *pVVar1;
  double dVar2;
  double dVar3;
  Vector<double,_3> *pVVar4;
  int row_1;
  long lVar5;
  Matrix<double,_3,_4> *res;
  Vector<double,_3> *in_RDI;
  Vector<double,_3> *pVVar6;
  int row;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  
  pVVar4 = in_RDI;
  *(undefined8 *)((long)(in_RDI + 3) + 8) = 0;
  *(undefined8 *)((long)(in_RDI + 3) + 0x10) = 0;
  *(undefined8 *)((long)(in_RDI + 2) + 0x10) = 0;
  in_RDI[3].m_data[0] = 0;
  in_RDI[2].m_data[0] = 0;
  *(undefined8 *)((long)(in_RDI + 2) + 8) = 0;
  in_RDI[1].m_data[1] = 0.0;
  in_RDI[1].m_data[2] = 0.0;
  in_RDI->m_data[2] = 0.0;
  in_RDI[1].m_data[0] = 0.0;
  in_RDI->m_data[0] = 0.0;
  in_RDI->m_data[1] = 0.0;
  lVar5 = 0;
  lVar7 = 0;
  pVVar6 = in_RDI;
  do {
    lVar8 = 0;
    do {
      uVar9 = 0x3ff0000000000000;
      if (lVar5 != lVar8) {
        uVar9 = 0;
      }
      *(undefined8 *)((long)pVVar6->m_data + lVar8) = uVar9;
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x60);
    lVar7 = lVar7 + 1;
    pVVar6 = (Vector<double,_3> *)(pVVar6->m_data + 1);
    lVar5 = lVar5 + 0x18;
  } while (lVar7 != 3);
  lVar5 = 0;
  do {
    dVar2 = (a->m_data).m_data[0].m_data[lVar5];
    lVar7 = 0;
    pVVar6 = in_RDI;
    do {
      pVVar1 = (b->m_data).m_data + lVar7;
      dVar3 = pVVar1[1].m_data[0];
      ((Vector<tcu::Vector<double,_3>,_4> *)pVVar6->m_data)->m_data[0].m_data[0] =
           pVVar1->m_data[0] * dVar2 + 0.0;
      pVVar6[1].m_data[0] = dVar3 * dVar2 + 0.0;
      lVar7 = lVar7 + 2;
      pVVar6 = pVVar6 + 2;
    } while (lVar7 != 4);
    lVar5 = lVar5 + 1;
    in_RDI = (Vector<double,_3> *)(in_RDI->m_data + 1);
  } while (lVar5 != 3);
  return (Matrix<double,_3,_4> *)pVVar4;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}